

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O2

void __thiscall YAML::NodeBuilder::RegisterAnchor(NodeBuilder *this,anchor_t anchor,node *node)

{
  node *local_8;
  
  if (anchor != 0) {
    local_8 = node;
    std::vector<YAML::detail::node*,std::allocator<YAML::detail::node*>>::
    emplace_back<YAML::detail::node*>
              ((vector<YAML::detail::node*,std::allocator<YAML::detail::node*>> *)&this->m_anchors,
               &local_8);
  }
  return;
}

Assistant:

void NodeBuilder::RegisterAnchor(anchor_t anchor, detail::node& node) {
  if (anchor) {
    assert(anchor == m_anchors.size());
    m_anchors.push_back(&node);
  }
}